

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::_InternalSerialize
          (TensorValue_RepeatedBytes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  ulong uVar1;
  uint8_t *puVar2;
  int size;
  string *s;
  size_t __n;
  
  s = (string *)((ulong)(this->values_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  if (s->_M_string_length != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffc;
    data = *(void **)(uVar1 + 8);
    size = (int)*(undefined8 *)(uVar1 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* TensorValue_RepeatedBytes::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBytes)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // bytes values = 1;
  if (!this->_internal_values().empty()) {
    target = stream->WriteBytesMaybeAliased(
        1, this->_internal_values(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue.RepeatedBytes)
  return target;
}